

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

void __thiscall
chrono::ChBezierCurveTracker::reset(ChBezierCurveTracker *this,ChVector<double> *loc)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_> points;
  PointSpec local_58;
  ChVector<double> v;
  
  points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0x10;
  uVar4 = 0;
  while( true ) {
    lVar2 = **(long **)this;
    if ((ulong)(((*(long **)this)[1] - lVar2) / 0x18) <= uVar4) break;
    v.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])loc->m_data,*(undefined1 (*) [16])(lVar2 + -0x10 + lVar3))
    ;
    v.m_data[2] = loc->m_data[2] - *(double *)(lVar2 + lVar3);
    local_58.m_dist2 = ChVector<double>::Length2(&v);
    local_58.m_index = uVar4;
    std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>::
    emplace_back<chrono::PointSpec>(&points,&local_58);
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x18;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<chrono::PointSpec*,std::vector<chrono::PointSpec,std::allocator<chrono::PointSpec>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(chrono::PointSpec_const&,chrono::PointSpec_const&)>>
            ((__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
              )points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<chrono::PointSpec_*,_std::vector<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>_>
              )points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>.
               _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_chrono::PointSpec_&,_const_chrono::PointSpec_&)>)
             0xa3e658);
  *(undefined8 *)(this + 0x18) = 0x3fe0000000000000;
  sVar1 = (points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>._M_impl.
           super__Vector_impl_data._M_start)->m_index;
  *(size_t *)(this + 0x10) = sVar1;
  if (sVar1 != 0) {
    lVar3 = **(long **)this;
    if (sVar1 != ((*(long **)this)[1] - lVar3) / 0x18 - 1U) {
      lVar2 = sVar1 * 0x18;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(double *)(lVar3 + lVar2) - loc->m_data[0];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(double *)(lVar3 + -0x18 + lVar2) - loc->m_data[0];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (*(double *)(lVar3 + 8 + lVar2) - loc->m_data[1]) *
                     (*(double *)(lVar3 + -0x10 + lVar2) - loc->m_data[1]);
      auVar5 = vfmadd231sd_fma(auVar8,auVar5,auVar7);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(double *)(lVar3 + -8 + lVar2) - loc->m_data[2];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(double *)(lVar3 + 0x10 + lVar2) - loc->m_data[2];
      auVar5 = vfmadd213sd_fma(auVar6,auVar9,auVar5);
      if (0.0 <= auVar5._0_8_) goto LAB_00a3e62c;
    }
    *(size_t *)(this + 0x10) = sVar1 - 1;
  }
LAB_00a3e62c:
  std::_Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>::~_Vector_base
            (&points.super__Vector_base<chrono::PointSpec,_std::allocator<chrono::PointSpec>_>);
  return;
}

Assistant:

void ChBezierCurveTracker::reset(const ChVector<>& loc) {
    // Walk all curve points and calculate the distance to the specified reset
    // location, then sort them in increasing order.
    std::vector<PointSpec> points;

    for (size_t i = 0; i < m_path->getNumPoints(); i++)
        points.push_back(PointSpec(i, (loc - m_path->m_points[i]).Length2()));

    std::sort(points.begin(), points.end(), comparePoints);

    // Set the initial guess to be at t=0.5 in either the interval starting at
    // the point with minimum distance or in the previous interval.
    m_curParam = 0.5f;
    m_curInterval = points[0].m_index;

    if (m_curInterval == 0)
        return;

    if (m_curInterval == m_path->getNumPoints() - 1) {
        m_curInterval--;
        return;
    }

    ChVector<> loc2cur = m_path->m_points[m_curInterval] - loc;
    ChVector<> loc2prev = m_path->m_points[m_curInterval - 1] - loc;

    if (Vdot(loc2cur, loc2prev) < 0)
        m_curInterval--;
}